

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type jsteemann::atoi<long>(char *p,char *e,bool *valid)

{
  long lVar1;
  type tVar2;
  bool bVar3;
  byte bVar4;
  
  if (p == e) {
    *valid = false;
    return 0;
  }
  if (*p == '-') {
    lVar1 = atoi_negative<long>(p + 1,e,valid);
    return lVar1;
  }
  if (*p == '+') {
    lVar1 = atoi_positive<long>(p + 1,e,valid);
    return lVar1;
  }
  if (p == e) {
    bVar3 = false;
    tVar2 = 0;
  }
  else {
    tVar2 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_001286ae:
        bVar3 = false;
        goto LAB_001286ab;
      }
      bVar4 = *p - 0x30;
      if ((0xccccccccccccccc < tVar2) || (tVar2 == 0xccccccccccccccc && 7 < bVar4))
      goto LAB_001286ae;
      tVar2 = (ulong)bVar4 + tVar2 * 10;
      p = p + 1;
    } while (p < e);
    bVar3 = true;
  }
LAB_001286ab:
  *valid = bVar3;
  return tVar2;
}

Assistant:

inline typename std::enable_if<std::is_signed<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    return atoi_negative<T>(++p, e, valid);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}